

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined8 *puVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int iVar13;
  int iVar14;
  undefined4 uVar15;
  Scene *pSVar16;
  float **ppfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  Geometry *pGVar22;
  RTCFilterFunctionN p_Var23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  ulong uVar31;
  long lVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  NodeRef *pNVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  float fVar41;
  float fVar51;
  float fVar52;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar53;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar54;
  float fVar55;
  float fVar65;
  float fVar67;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar66;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar71;
  float fVar74;
  float fVar75;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar76;
  float fVar77;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar93 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar97 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar105 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar143 [16];
  UVIdentity<4> mapUV;
  undefined1 local_af8 [16];
  size_t local_ae8;
  ulong local_ae0;
  size_t local_ad8;
  undefined1 (*local_ad0) [16];
  RTCFilterFunctionNArguments args;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  undefined1 local_8f8 [16];
  UVIdentity<4> *local_8e8;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined4 local_868;
  undefined4 uStack_864;
  undefined4 uStack_860;
  undefined4 uStack_85c;
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined1 local_848 [16];
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined4 local_828;
  undefined4 uStack_824;
  undefined4 uStack_820;
  undefined4 uStack_81c;
  undefined1 local_818 [16];
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  pNVar36 = stack + 1;
  stack[0] = root;
  fVar10 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar11 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar12 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar92 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar94 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar95 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar115 = fVar92 * 0.99999964;
  fVar120 = fVar94 * 0.99999964;
  fVar101 = fVar95 * 0.99999964;
  fVar92 = fVar92 * 1.0000004;
  fVar94 = fVar94 * 1.0000004;
  fVar95 = fVar95 * 1.0000004;
  local_ae0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar39 = local_ae0 ^ 0x10;
  iVar13 = (tray->tnear).field_0.i[k];
  iVar14 = (tray->tfar).field_0.i[k];
  local_ad0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar40 = true;
  do {
    uVar34 = pNVar36[-1].ptr;
    pNVar36 = pNVar36 + -1;
    while ((uVar34 & 8) == 0) {
      pfVar8 = (float *)(uVar34 + 0x20 + local_ae0);
      auVar60._0_4_ = (*pfVar8 - fVar10) * fVar115;
      auVar60._4_4_ = (pfVar8[1] - fVar10) * fVar115;
      auVar60._8_4_ = (pfVar8[2] - fVar10) * fVar115;
      auVar60._12_4_ = (pfVar8[3] - fVar10) * fVar115;
      pfVar8 = (float *)(uVar34 + 0x20 + uVar37);
      auVar56._0_4_ = (*pfVar8 - fVar11) * fVar120;
      auVar56._4_4_ = (pfVar8[1] - fVar11) * fVar120;
      auVar56._8_4_ = (pfVar8[2] - fVar11) * fVar120;
      auVar56._12_4_ = (pfVar8[3] - fVar11) * fVar120;
      auVar42 = maxps(auVar60,auVar56);
      pfVar8 = (float *)(uVar34 + 0x20 + uVar38);
      auVar57._0_4_ = (*pfVar8 - fVar12) * fVar101;
      auVar57._4_4_ = (pfVar8[1] - fVar12) * fVar101;
      auVar57._8_4_ = (pfVar8[2] - fVar12) * fVar101;
      auVar57._12_4_ = (pfVar8[3] - fVar12) * fVar101;
      auVar58._4_4_ = iVar13;
      auVar58._0_4_ = iVar13;
      auVar58._8_4_ = iVar13;
      auVar58._12_4_ = iVar13;
      auVar58 = maxps(auVar57,auVar58);
      auVar58 = maxps(auVar42,auVar58);
      pfVar8 = (float *)(uVar34 + 0x20 + uVar39);
      auVar59._0_4_ = (*pfVar8 - fVar10) * fVar92;
      auVar59._4_4_ = (pfVar8[1] - fVar10) * fVar92;
      auVar59._8_4_ = (pfVar8[2] - fVar10) * fVar92;
      auVar59._12_4_ = (pfVar8[3] - fVar10) * fVar92;
      pfVar8 = (float *)(uVar34 + 0x20 + (uVar37 ^ 0x10));
      auVar72._0_4_ = (*pfVar8 - fVar11) * fVar94;
      auVar72._4_4_ = (pfVar8[1] - fVar11) * fVar94;
      auVar72._8_4_ = (pfVar8[2] - fVar11) * fVar94;
      auVar72._12_4_ = (pfVar8[3] - fVar11) * fVar94;
      auVar60 = minps(auVar59,auVar72);
      pfVar8 = (float *)(uVar34 + 0x20 + (uVar38 ^ 0x10));
      auVar73._0_4_ = (*pfVar8 - fVar12) * fVar95;
      auVar73._4_4_ = (pfVar8[1] - fVar12) * fVar95;
      auVar73._8_4_ = (pfVar8[2] - fVar12) * fVar95;
      auVar73._12_4_ = (pfVar8[3] - fVar12) * fVar95;
      auVar42._4_4_ = iVar14;
      auVar42._0_4_ = iVar14;
      auVar42._8_4_ = iVar14;
      auVar42._12_4_ = iVar14;
      auVar42 = minps(auVar73,auVar42);
      auVar42 = minps(auVar60,auVar42);
      auVar43._4_4_ = -(uint)(auVar58._4_4_ <= auVar42._4_4_);
      auVar43._0_4_ = -(uint)(auVar58._0_4_ <= auVar42._0_4_);
      auVar43._8_4_ = -(uint)(auVar58._8_4_ <= auVar42._8_4_);
      auVar43._12_4_ = -(uint)(auVar58._12_4_ <= auVar42._12_4_);
      uVar33 = movmskps((int)root.ptr,auVar43);
      root.ptr = (size_t)uVar33;
      if (uVar33 == 0) goto LAB_0025b4f0;
      uVar31 = uVar34 & 0xfffffffffffffff0;
      lVar32 = 0;
      if ((byte)uVar33 != 0) {
        for (; ((byte)uVar33 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
        }
      }
      uVar34 = *(ulong *)(uVar31 + lVar32 * 8);
      uVar33 = (uVar33 & 0xff) - 1 & uVar33 & 0xff;
      root.ptr = (size_t)uVar33;
      if (uVar33 != 0) {
        pNVar36->ptr = uVar34;
        pNVar36 = pNVar36 + 1;
        lVar32 = 0;
        if (root.ptr != 0) {
          for (; (uVar33 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
          }
        }
        uVar34 = *(ulong *)(uVar31 + lVar32 * 8);
        uVar33 = uVar33 - 1 & uVar33;
        uVar35 = (ulong)uVar33;
        if (uVar33 != 0) {
          do {
            pNVar36->ptr = uVar34;
            pNVar36 = pNVar36 + 1;
            root.ptr = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> root.ptr & 1) == 0; root.ptr = root.ptr + 1) {
              }
            }
            uVar34 = *(ulong *)(uVar31 + root.ptr * 8);
            uVar35 = uVar35 & uVar35 - 1;
          } while (uVar35 != 0);
        }
      }
    }
    local_ae8 = (ulong)((uint)uVar34 & 0xf) - 8;
    if (local_ae8 != 0) {
      uVar34 = uVar34 & 0xfffffffffffffff0;
      root.ptr = 0;
      do {
        lVar32 = root.ptr * 0x50;
        pSVar16 = context->scene;
        ppfVar17 = (pSVar16->vertices).items;
        pfVar18 = ppfVar17[*(uint *)(uVar34 + 0x30 + lVar32)];
        pfVar8 = pfVar18 + *(uint *)(uVar34 + lVar32);
        pfVar1 = pfVar18 + *(uint *)(uVar34 + 0x10 + lVar32);
        pfVar18 = pfVar18 + *(uint *)(uVar34 + 0x20 + lVar32);
        pfVar19 = ppfVar17[*(uint *)(uVar34 + 0x34 + lVar32)];
        pfVar2 = pfVar19 + *(uint *)(uVar34 + 4 + lVar32);
        pfVar3 = pfVar19 + *(uint *)(uVar34 + 0x14 + lVar32);
        pfVar19 = pfVar19 + *(uint *)(uVar34 + 0x24 + lVar32);
        pfVar20 = ppfVar17[*(uint *)(uVar34 + 0x38 + lVar32)];
        pfVar4 = pfVar20 + *(uint *)(uVar34 + 8 + lVar32);
        pfVar5 = pfVar20 + *(uint *)(uVar34 + 0x18 + lVar32);
        pfVar20 = pfVar20 + *(uint *)(uVar34 + 0x28 + lVar32);
        pfVar21 = ppfVar17[*(uint *)(uVar34 + 0x3c + lVar32)];
        pfVar6 = pfVar21 + *(uint *)(uVar34 + 0xc + lVar32);
        pfVar7 = pfVar21 + *(uint *)(uVar34 + 0x1c + lVar32);
        pfVar21 = pfVar21 + *(uint *)(uVar34 + 0x2c + lVar32);
        puVar9 = (undefined8 *)(uVar34 + 0x30 + lVar32);
        local_928 = *puVar9;
        uStack_920 = puVar9[1];
        puVar9 = (undefined8 *)(uVar34 + 0x40 + lVar32);
        local_938 = *puVar9;
        uStack_930 = puVar9[1];
        fVar124 = *(float *)(ray + k * 4);
        fVar83 = *(float *)(ray + k * 4 + 0x10);
        fVar128 = *(float *)(ray + k * 4 + 0x20);
        fVar41 = *pfVar8 - fVar124;
        fVar51 = *pfVar2 - fVar124;
        fVar52 = *pfVar4 - fVar124;
        fVar53 = *pfVar6 - fVar124;
        fVar129 = pfVar8[1] - fVar83;
        fVar131 = pfVar2[1] - fVar83;
        fVar133 = pfVar4[1] - fVar83;
        fVar135 = pfVar6[1] - fVar83;
        fVar141 = pfVar8[2] - fVar128;
        fVar144 = pfVar2[2] - fVar128;
        fVar146 = pfVar4[2] - fVar128;
        fVar148 = pfVar6[2] - fVar128;
        fVar54 = *pfVar1 - fVar124;
        fVar65 = *pfVar3 - fVar124;
        fVar67 = *pfVar5 - fVar124;
        fVar69 = *pfVar7 - fVar124;
        fVar71 = pfVar1[1] - fVar83;
        fVar74 = pfVar3[1] - fVar83;
        fVar75 = pfVar5[1] - fVar83;
        fVar76 = pfVar7[1] - fVar83;
        fVar102 = pfVar1[2] - fVar128;
        fVar106 = pfVar3[2] - fVar128;
        fVar109 = pfVar5[2] - fVar128;
        fVar112 = pfVar7[2] - fVar128;
        fVar121 = *pfVar18 - fVar124;
        fVar122 = *pfVar19 - fVar124;
        fVar123 = *pfVar20 - fVar124;
        fVar124 = *pfVar21 - fVar124;
        fVar77 = pfVar18[1] - fVar83;
        fVar80 = pfVar19[1] - fVar83;
        fVar81 = pfVar20[1] - fVar83;
        fVar83 = pfVar21[1] - fVar83;
        fVar125 = pfVar18[2] - fVar128;
        fVar126 = pfVar19[2] - fVar128;
        fVar127 = pfVar20[2] - fVar128;
        fVar128 = pfVar21[2] - fVar128;
        fVar103 = fVar121 - fVar41;
        fVar107 = fVar122 - fVar51;
        fVar110 = fVar123 - fVar52;
        fVar113 = fVar124 - fVar53;
        fVar137 = fVar77 - fVar129;
        fVar138 = fVar80 - fVar131;
        fVar139 = fVar81 - fVar133;
        fVar140 = fVar83 - fVar135;
        fVar116 = fVar125 - fVar141;
        fVar117 = fVar126 - fVar144;
        fVar118 = fVar127 - fVar146;
        fVar119 = fVar128 - fVar148;
        fVar82 = *(float *)(ray + k * 4 + 0x50);
        fVar87 = *(float *)(ray + k * 4 + 0x60);
        fVar89 = *(float *)(ray + k * 4 + 0x40);
        local_918 = (fVar137 * (fVar125 + fVar141) - (fVar77 + fVar129) * fVar116) * fVar89 +
                    ((fVar121 + fVar41) * fVar116 - (fVar125 + fVar141) * fVar103) * fVar82 +
                    (fVar103 * (fVar77 + fVar129) - (fVar121 + fVar41) * fVar137) * fVar87;
        fStack_914 = (fVar138 * (fVar126 + fVar144) - (fVar80 + fVar131) * fVar117) * fVar89 +
                     ((fVar122 + fVar51) * fVar117 - (fVar126 + fVar144) * fVar107) * fVar82 +
                     (fVar107 * (fVar80 + fVar131) - (fVar122 + fVar51) * fVar138) * fVar87;
        auVar84._0_8_ = CONCAT44(fStack_914,local_918);
        auVar84._8_4_ =
             (fVar139 * (fVar127 + fVar146) - (fVar81 + fVar133) * fVar118) * fVar89 +
             ((fVar123 + fVar52) * fVar118 - (fVar127 + fVar146) * fVar110) * fVar82 +
             (fVar110 * (fVar81 + fVar133) - (fVar123 + fVar52) * fVar139) * fVar87;
        auVar84._12_4_ =
             (fVar140 * (fVar128 + fVar148) - (fVar83 + fVar135) * fVar119) * fVar89 +
             ((fVar124 + fVar53) * fVar119 - (fVar128 + fVar148) * fVar113) * fVar82 +
             (fVar113 * (fVar83 + fVar135) - (fVar124 + fVar53) * fVar140) * fVar87;
        fVar104 = fVar41 - fVar54;
        fVar108 = fVar51 - fVar65;
        fVar111 = fVar52 - fVar67;
        fVar114 = fVar53 - fVar69;
        fVar96 = fVar129 - fVar71;
        fVar98 = fVar131 - fVar74;
        fVar99 = fVar133 - fVar75;
        fVar100 = fVar135 - fVar76;
        fVar55 = fVar141 - fVar102;
        fVar66 = fVar144 - fVar106;
        fVar68 = fVar146 - fVar109;
        fVar70 = fVar148 - fVar112;
        local_908 = (fVar96 * (fVar141 + fVar102) - (fVar129 + fVar71) * fVar55) * fVar89 +
                    ((fVar41 + fVar54) * fVar55 - (fVar141 + fVar102) * fVar104) * fVar82 +
                    (fVar104 * (fVar129 + fVar71) - (fVar41 + fVar54) * fVar96) * fVar87;
        fStack_904 = (fVar98 * (fVar144 + fVar106) - (fVar131 + fVar74) * fVar66) * fVar89 +
                     ((fVar51 + fVar65) * fVar66 - (fVar144 + fVar106) * fVar108) * fVar82 +
                     (fVar108 * (fVar131 + fVar74) - (fVar51 + fVar65) * fVar98) * fVar87;
        fStack_900 = (fVar99 * (fVar146 + fVar109) - (fVar133 + fVar75) * fVar68) * fVar89 +
                     ((fVar52 + fVar67) * fVar68 - (fVar146 + fVar109) * fVar111) * fVar82 +
                     (fVar111 * (fVar133 + fVar75) - (fVar52 + fVar67) * fVar99) * fVar87;
        fStack_8fc = (fVar100 * (fVar148 + fVar112) - (fVar135 + fVar76) * fVar70) * fVar89 +
                     ((fVar53 + fVar69) * fVar70 - (fVar148 + fVar112) * fVar114) * fVar82 +
                     (fVar114 * (fVar135 + fVar76) - (fVar53 + fVar69) * fVar100) * fVar87;
        fVar142 = fVar54 - fVar121;
        fVar145 = fVar65 - fVar122;
        fVar147 = fVar67 - fVar123;
        fVar149 = fVar69 - fVar124;
        fVar86 = fVar71 - fVar77;
        fVar88 = fVar74 - fVar80;
        fVar90 = fVar75 - fVar81;
        fVar91 = fVar76 - fVar83;
        fVar130 = fVar102 - fVar125;
        fVar132 = fVar106 - fVar126;
        fVar134 = fVar109 - fVar127;
        fVar136 = fVar112 - fVar128;
        auVar61._0_4_ =
             (fVar86 * (fVar125 + fVar102) - (fVar77 + fVar71) * fVar130) * fVar89 +
             ((fVar121 + fVar54) * fVar130 - (fVar125 + fVar102) * fVar142) * fVar82 +
             (fVar142 * (fVar77 + fVar71) - (fVar121 + fVar54) * fVar86) * fVar87;
        auVar61._4_4_ =
             (fVar88 * (fVar126 + fVar106) - (fVar80 + fVar74) * fVar132) * fVar89 +
             ((fVar122 + fVar65) * fVar132 - (fVar126 + fVar106) * fVar145) * fVar82 +
             (fVar145 * (fVar80 + fVar74) - (fVar122 + fVar65) * fVar88) * fVar87;
        auVar61._8_4_ =
             (fVar90 * (fVar127 + fVar109) - (fVar81 + fVar75) * fVar134) * fVar89 +
             ((fVar123 + fVar67) * fVar134 - (fVar127 + fVar109) * fVar147) * fVar82 +
             (fVar147 * (fVar81 + fVar75) - (fVar123 + fVar67) * fVar90) * fVar87;
        auVar61._12_4_ =
             (fVar91 * (fVar128 + fVar112) - (fVar83 + fVar76) * fVar136) * fVar89 +
             ((fVar124 + fVar69) * fVar136 - (fVar128 + fVar112) * fVar149) * fVar82 +
             (fVar149 * (fVar83 + fVar76) - (fVar124 + fVar69) * fVar91) * fVar87;
        fVar65 = local_918 + local_908 + auVar61._0_4_;
        fVar67 = fStack_914 + fStack_904 + auVar61._4_4_;
        fVar69 = auVar84._8_4_ + fStack_900 + auVar61._8_4_;
        fVar71 = auVar84._12_4_ + fStack_8fc + auVar61._12_4_;
        auVar44._8_4_ = auVar84._8_4_;
        auVar44._0_8_ = auVar84._0_8_;
        auVar44._12_4_ = auVar84._12_4_;
        auVar24._4_4_ = fStack_904;
        auVar24._0_4_ = local_908;
        auVar24._8_4_ = fStack_900;
        auVar24._12_4_ = fStack_8fc;
        auVar58 = minps(auVar44,auVar24);
        auVar58 = minps(auVar58,auVar61);
        auVar25._4_4_ = fStack_904;
        auVar25._0_4_ = local_908;
        auVar25._8_4_ = fStack_900;
        auVar25._12_4_ = fStack_8fc;
        auVar42 = maxps(auVar84,auVar25);
        auVar42 = maxps(auVar42,auVar61);
        fVar124 = ABS(fVar65) * 1.1920929e-07;
        fVar83 = ABS(fVar67) * 1.1920929e-07;
        fVar128 = ABS(fVar69) * 1.1920929e-07;
        fVar54 = ABS(fVar71) * 1.1920929e-07;
        auVar85._4_4_ = -(uint)(auVar42._4_4_ <= fVar83);
        auVar85._0_4_ = -(uint)(auVar42._0_4_ <= fVar124);
        auVar85._8_4_ = -(uint)(auVar42._8_4_ <= fVar128);
        auVar85._12_4_ = -(uint)(auVar42._12_4_ <= fVar54);
        auVar45._4_4_ = -(uint)(-fVar83 <= auVar58._4_4_);
        auVar45._0_4_ = -(uint)(-fVar124 <= auVar58._0_4_);
        auVar45._8_4_ = -(uint)(-fVar128 <= auVar58._8_4_);
        auVar45._12_4_ = -(uint)(-fVar54 <= auVar58._12_4_);
        auVar85 = auVar85 | auVar45;
        iVar30 = movmskps((int)lVar32,auVar85);
        local_ad8 = root.ptr;
        if (iVar30 != 0) {
          auVar97._0_4_ = fVar96 * fVar130 - fVar86 * fVar55;
          auVar97._4_4_ = fVar98 * fVar132 - fVar88 * fVar66;
          auVar97._8_4_ = fVar99 * fVar134 - fVar90 * fVar68;
          auVar97._12_4_ = fVar100 * fVar136 - fVar91 * fVar70;
          auVar46._4_4_ = -(uint)(ABS(fVar98 * fVar117) < ABS(fVar88 * fVar66));
          auVar46._0_4_ = -(uint)(ABS(fVar96 * fVar116) < ABS(fVar86 * fVar55));
          auVar46._8_4_ = -(uint)(ABS(fVar99 * fVar118) < ABS(fVar90 * fVar68));
          auVar46._12_4_ = -(uint)(ABS(fVar100 * fVar119) < ABS(fVar91 * fVar70));
          auVar28._4_4_ = fVar138 * fVar66 - fVar98 * fVar117;
          auVar28._0_4_ = fVar137 * fVar55 - fVar96 * fVar116;
          auVar28._8_4_ = fVar139 * fVar68 - fVar99 * fVar118;
          auVar28._12_4_ = fVar140 * fVar70 - fVar100 * fVar119;
          local_898 = blendvps(auVar97,auVar28,auVar46);
          auVar143._0_4_ = fVar142 * fVar55 - fVar104 * fVar130;
          auVar143._4_4_ = fVar145 * fVar66 - fVar108 * fVar132;
          auVar143._8_4_ = fVar147 * fVar68 - fVar111 * fVar134;
          auVar143._12_4_ = fVar149 * fVar70 - fVar114 * fVar136;
          auVar47._4_4_ = -(uint)(ABS(fVar107 * fVar66) < ABS(fVar108 * fVar132));
          auVar47._0_4_ = -(uint)(ABS(fVar103 * fVar55) < ABS(fVar104 * fVar130));
          auVar47._8_4_ = -(uint)(ABS(fVar110 * fVar68) < ABS(fVar111 * fVar134));
          auVar47._12_4_ = -(uint)(ABS(fVar113 * fVar70) < ABS(fVar114 * fVar136));
          auVar26._4_4_ = fVar117 * fVar108 - fVar107 * fVar66;
          auVar26._0_4_ = fVar116 * fVar104 - fVar103 * fVar55;
          auVar26._8_4_ = fVar118 * fVar111 - fVar110 * fVar68;
          auVar26._12_4_ = fVar119 * fVar114 - fVar113 * fVar70;
          local_888 = blendvps(auVar143,auVar26,auVar47);
          auVar105._0_4_ = fVar104 * fVar86 - fVar142 * fVar96;
          auVar105._4_4_ = fVar108 * fVar88 - fVar145 * fVar98;
          auVar105._8_4_ = fVar111 * fVar90 - fVar147 * fVar99;
          auVar105._12_4_ = fVar114 * fVar91 - fVar149 * fVar100;
          auVar48._4_4_ = -(uint)(ABS(fVar108 * fVar138) < ABS(fVar145 * fVar98));
          auVar48._0_4_ = -(uint)(ABS(fVar104 * fVar137) < ABS(fVar142 * fVar96));
          auVar48._8_4_ = -(uint)(ABS(fVar111 * fVar139) < ABS(fVar147 * fVar99));
          auVar48._12_4_ = -(uint)(ABS(fVar114 * fVar140) < ABS(fVar149 * fVar100));
          auVar29._4_4_ = fVar107 * fVar98 - fVar108 * fVar138;
          auVar29._0_4_ = fVar103 * fVar96 - fVar104 * fVar137;
          auVar29._8_4_ = fVar110 * fVar99 - fVar111 * fVar139;
          auVar29._12_4_ = fVar113 * fVar100 - fVar114 * fVar140;
          local_878 = blendvps(auVar105,auVar29,auVar48);
          fVar54 = fVar89 * local_898._0_4_ + fVar82 * local_888._0_4_ + fVar87 * local_878._0_4_;
          fVar55 = fVar89 * local_898._4_4_ + fVar82 * local_888._4_4_ + fVar87 * local_878._4_4_;
          fVar66 = fVar89 * local_898._8_4_ + fVar82 * local_888._8_4_ + fVar87 * local_878._8_4_;
          fVar68 = fVar89 * local_898._12_4_ + fVar82 * local_888._12_4_ + fVar87 * local_878._12_4_
          ;
          fVar54 = fVar54 + fVar54;
          fVar55 = fVar55 + fVar55;
          fVar66 = fVar66 + fVar66;
          fVar68 = fVar68 + fVar68;
          auVar62._0_4_ = fVar141 * local_878._0_4_;
          auVar62._4_4_ = fVar144 * local_878._4_4_;
          auVar62._8_4_ = fVar146 * local_878._8_4_;
          auVar62._12_4_ = fVar148 * local_878._12_4_;
          fVar87 = fVar41 * local_898._0_4_ + fVar129 * local_888._0_4_ + auVar62._0_4_;
          fVar89 = fVar51 * local_898._4_4_ + fVar131 * local_888._4_4_ + auVar62._4_4_;
          fVar41 = fVar52 * local_898._8_4_ + fVar133 * local_888._8_4_ + auVar62._8_4_;
          fVar51 = fVar53 * local_898._12_4_ + fVar135 * local_888._12_4_ + auVar62._12_4_;
          auVar27._4_4_ = fVar55;
          auVar27._0_4_ = fVar54;
          auVar27._8_4_ = fVar66;
          auVar27._12_4_ = fVar68;
          auVar58 = rcpps(auVar62,auVar27);
          fVar124 = auVar58._0_4_;
          fVar83 = auVar58._4_4_;
          fVar128 = auVar58._8_4_;
          fVar82 = auVar58._12_4_;
          local_8a8._0_4_ = ((1.0 - fVar54 * fVar124) * fVar124 + fVar124) * (fVar87 + fVar87);
          local_8a8._4_4_ = ((1.0 - fVar55 * fVar83) * fVar83 + fVar83) * (fVar89 + fVar89);
          local_8a8._8_4_ = ((1.0 - fVar66 * fVar128) * fVar128 + fVar128) * (fVar41 + fVar41);
          local_8a8._12_4_ = ((1.0 - fVar68 * fVar82) * fVar82 + fVar82) * (fVar51 + fVar51);
          fVar124 = *(float *)(ray + k * 4 + 0x80);
          fVar83 = *(float *)(ray + k * 4 + 0x30);
          auVar63._0_4_ =
               -(uint)(local_8a8._0_4_ <= fVar124 && fVar83 <= local_8a8._0_4_) & auVar85._0_4_;
          auVar63._4_4_ =
               -(uint)(local_8a8._4_4_ <= fVar124 && fVar83 <= local_8a8._4_4_) & auVar85._4_4_;
          auVar63._8_4_ =
               -(uint)(local_8a8._8_4_ <= fVar124 && fVar83 <= local_8a8._8_4_) & auVar85._8_4_;
          auVar63._12_4_ =
               -(uint)(local_8a8._12_4_ <= fVar124 && fVar83 <= local_8a8._12_4_) & auVar85._12_4_;
          iVar30 = movmskps(iVar30,auVar63);
          if (iVar30 != 0) {
            local_8d8._0_4_ = auVar63._0_4_ & -(uint)(fVar54 != 0.0);
            local_8d8._4_4_ = auVar63._4_4_ & -(uint)(fVar55 != 0.0);
            local_8d8._8_4_ = auVar63._8_4_ & -(uint)(fVar66 != 0.0);
            local_8d8._12_4_ = auVar63._12_4_ & -(uint)(fVar68 != 0.0);
            uVar33 = movmskps(iVar30,local_8d8);
            if (uVar33 != 0) {
              fStack_910 = auVar84._8_4_;
              fStack_90c = auVar84._12_4_;
              local_8f8._4_4_ = fVar67;
              local_8f8._0_4_ = fVar65;
              local_8f8._8_4_ = fVar69;
              local_8f8._12_4_ = fVar71;
              local_8e8 = &mapUV;
              auVar58 = rcpps(local_8a8,local_8f8);
              fVar83 = auVar58._0_4_;
              fVar128 = auVar58._4_4_;
              fVar82 = auVar58._8_4_;
              fVar87 = auVar58._12_4_;
              fVar83 = (float)(-(uint)(1e-18 <= ABS(fVar65)) &
                              (uint)(((float)DAT_01f7ba10 - fVar65 * fVar83) * fVar83 + fVar83));
              fVar128 = (float)(-(uint)(1e-18 <= ABS(fVar67)) &
                               (uint)((DAT_01f7ba10._4_4_ - fVar67 * fVar128) * fVar128 + fVar128));
              fVar82 = (float)(-(uint)(1e-18 <= ABS(fVar69)) &
                              (uint)((DAT_01f7ba10._8_4_ - fVar69 * fVar82) * fVar82 + fVar82));
              fVar87 = (float)(-(uint)(1e-18 <= ABS(fVar71)) &
                              (uint)((DAT_01f7ba10._12_4_ - fVar71 * fVar87) * fVar87 + fVar87));
              auVar93._0_4_ = local_918 * fVar83;
              auVar93._4_4_ = fStack_914 * fVar128;
              auVar93._8_4_ = auVar84._8_4_ * fVar82;
              auVar93._12_4_ = auVar84._12_4_ * fVar87;
              local_8c8 = minps(auVar93,_DAT_01f7ba10);
              auVar78._0_4_ = fVar83 * local_908;
              auVar78._4_4_ = fVar128 * fStack_904;
              auVar78._8_4_ = fVar82 * fStack_900;
              auVar78._12_4_ = fVar87 * fStack_8fc;
              local_8b8 = minps(auVar78,_DAT_01f7ba10);
              uVar31 = (ulong)(uVar33 & 0xff);
              do {
                uVar35 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                local_808 = *(uint *)((long)&local_928 + uVar35 * 4);
                pGVar22 = (pSVar16->geometries).items[local_808].ptr;
                if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar22->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0025b506:
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    return bVar40;
                  }
                  local_838 = *(undefined4 *)(local_8c8 + uVar35 * 4);
                  local_828 = *(undefined4 *)(local_8b8 + uVar35 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + uVar35 * 4);
                  args.context = context->user;
                  uVar15 = *(undefined4 *)((long)&local_938 + uVar35 * 4);
                  auVar79._4_4_ = uVar15;
                  auVar79._0_4_ = uVar15;
                  auVar79._8_4_ = uVar15;
                  auVar79._12_4_ = uVar15;
                  local_868 = *(undefined4 *)(local_898 + uVar35 * 4);
                  local_858 = *(undefined4 *)(local_888 + uVar35 * 4);
                  uVar15 = *(undefined4 *)(local_878 + uVar35 * 4);
                  local_848._4_4_ = uVar15;
                  local_848._0_4_ = uVar15;
                  local_848._8_4_ = uVar15;
                  local_848._12_4_ = uVar15;
                  uStack_864 = local_868;
                  uStack_860 = local_868;
                  uStack_85c = local_868;
                  uStack_854 = local_858;
                  uStack_850 = local_858;
                  uStack_84c = local_858;
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  uStack_824 = local_828;
                  uStack_820 = local_828;
                  uStack_81c = local_828;
                  local_818 = auVar79;
                  uStack_804 = local_808;
                  uStack_800 = local_808;
                  uStack_7fc = local_808;
                  uStack_7f4 = (args.context)->instID[0];
                  local_7f8 = uStack_7f4;
                  uStack_7f0 = uStack_7f4;
                  uStack_7ec = uStack_7f4;
                  uStack_7e4 = (args.context)->instPrimID[0];
                  local_7e8 = uStack_7e4;
                  uStack_7e0 = uStack_7e4;
                  uStack_7dc = uStack_7e4;
                  local_af8 = *local_ad0;
                  args.valid = (int *)local_af8;
                  args.geometryUserPtr = pGVar22->userPtr;
                  args.hit = (RTCHitN *)&local_868;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar22->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar22->occlusionFilterN)(&args);
                  }
                  auVar64._8_4_ = 0xffffffff;
                  auVar64._0_8_ = 0xffffffffffffffff;
                  auVar64._12_4_ = 0xffffffff;
                  if (local_af8 == (undefined1  [16])0x0) {
                    auVar50._8_4_ = 0xffffffff;
                    auVar50._0_8_ = 0xffffffffffffffff;
                    auVar50._12_4_ = 0xffffffff;
                    auVar64 = auVar50 ^ auVar64;
                    auVar58 = pmovsxbd(auVar79,0x1010101);
                  }
                  else {
                    p_Var23 = context->args->filter;
                    auVar58 = pmovsxbd(auVar79,0x1010101);
                    if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var23)(&args);
                      auVar58 = pmovsxbd(auVar58,0x1010101);
                      auVar64._8_4_ = 0xffffffff;
                      auVar64._0_8_ = 0xffffffffffffffff;
                      auVar64._12_4_ = 0xffffffff;
                    }
                    auVar49._0_4_ = -(uint)(local_af8._0_4_ == 0);
                    auVar49._4_4_ = -(uint)(local_af8._4_4_ == 0);
                    auVar49._8_4_ = -(uint)(local_af8._8_4_ == 0);
                    auVar49._12_4_ = -(uint)(local_af8._12_4_ == 0);
                    auVar64 = auVar49 ^ auVar64;
                    auVar42 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar49
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar42;
                  }
                  if ((auVar58 & auVar64) != (undefined1  [16])0x0) goto LAB_0025b506;
                  *(float *)(ray + k * 4 + 0x80) = fVar124;
                }
                uVar31 = uVar31 ^ 1L << (uVar35 & 0x3f);
              } while (uVar31 != 0);
            }
          }
        }
        root.ptr = local_ad8 + 1;
      } while (root.ptr != local_ae8);
    }
LAB_0025b4f0:
    bVar40 = pNVar36 != stack;
    if (!bVar40) {
      return bVar40;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }